

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<Js::AsmJsModuleInfo::ModuleVar>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,ModuleVar *value)

{
  Type TVar1;
  BufferBuilder *value_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar2;
  
  value_00 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x30,this->alloc,0x35916e);
  value_00->clue = clue;
  value_00->offset = 0xffffffff;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a538;
  TVar1 = value->initialiser;
  value_00[1]._vptr_BufferBuilder = *(_func_int ***)value;
  value_00[1].clue = (LPCWSTR)TVar1;
  *(undefined8 *)&value_00[1].offset = *(undefined8 *)&value->isMutable;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a518;
  pIVar2 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend(builder->list,value_00,this->alloc);
  builder->list = pIVar2;
  return 0x18;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }